

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O2

string * __thiscall
ki::protocol::dml::MessageTemplate::get_name_abi_cxx11_
          (string *__return_storage_ptr__,MessageTemplate *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string MessageTemplate::get_name() const
	{
		return m_name;
	}